

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::GeneratedMessageReflection
          (GeneratedMessageReflection *this,Descriptor *descriptor,ReflectionSchema *schema,
          DescriptorPool *pool,MessageFactory *factory)

{
  int iVar1;
  DescriptorPool *local_60;
  MessageFactory *factory_local;
  DescriptorPool *pool_local;
  ReflectionSchema *schema_local;
  Descriptor *descriptor_local;
  GeneratedMessageReflection *this_local;
  
  Reflection::Reflection(&this->super_Reflection);
  (this->super_Reflection)._vptr_Reflection =
       (_func_int **)&PTR__GeneratedMessageReflection_006fac58;
  this->descriptor_ = descriptor;
  memcpy(&this->schema_,schema,0x30);
  local_60 = pool;
  if (pool == (DescriptorPool *)0x0) {
    local_60 = DescriptorPool::generated_pool();
  }
  this->descriptor_pool_ = local_60;
  this->message_factory_ = factory;
  this->last_non_weak_field_index_ = -1;
  iVar1 = Descriptor::field_count(this->descriptor_);
  this->last_non_weak_field_index_ = iVar1 + -1;
  return;
}

Assistant:

GeneratedMessageReflection::GeneratedMessageReflection(
    const Descriptor* descriptor, const ReflectionSchema& schema,
    const DescriptorPool* pool, MessageFactory* factory)
    : descriptor_(descriptor),
      schema_(schema),
      descriptor_pool_((pool == NULL) ? DescriptorPool::generated_pool()
                                      : pool),
      message_factory_(factory),
      last_non_weak_field_index_(-1) {
  last_non_weak_field_index_ = descriptor_->field_count() - 1;
}